

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# md4c.c
# Opt level: O2

MD_MARK * md_scan_left_for_resolved_mark
                    (MD_CTX *ctx,MD_MARK *mark_from,MD_OFFSET off,MD_MARK **p_cursor)

{
  MD_MARK *pMVar1;
  
  for (; ctx->marks <= mark_from; mark_from = mark_from + -1) {
    if ((mark_from->ch != 'D') && (mark_from->beg <= off)) {
      if (mark_from->end <= off) break;
      if ((mark_from->flags & 0x10) != 0) {
        pMVar1 = mark_from;
        if (p_cursor == (MD_MARK **)0x0) {
          return mark_from;
        }
        goto LAB_00536d57;
      }
    }
  }
  pMVar1 = (MD_MARK *)0x0;
  if (p_cursor != (MD_MARK **)0x0) {
LAB_00536d57:
    *p_cursor = mark_from;
  }
  return pMVar1;
}

Assistant:

static MD_MARK*
md_scan_left_for_resolved_mark(MD_CTX* ctx, MD_MARK* mark_from, OFF off, MD_MARK** p_cursor)
{
    MD_MARK* mark;

    for(mark = mark_from; mark >= ctx->marks; mark--) {
        if(mark->ch == 'D'  ||  mark->beg > off)
            continue;
        if(mark->beg <= off  &&  off < mark->end  &&  (mark->flags & MD_MARK_RESOLVED)) {
            if(p_cursor != NULL)
                *p_cursor = mark;
            return mark;
        }
        if(mark->end <= off)
            break;
    }

    if(p_cursor != NULL)
        *p_cursor = mark;
    return NULL;
}